

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

void nn_init(void)

{
  nn_mutex_lock(&self.lock);
  while ((self.flags & 2U) != 0) {
    nn_condvar_wait(&self.cond,&self.lock,-1);
  }
  self.flags = self.flags & 0xfffffffc;
  nn_mutex_unlock(&self.lock);
  return;
}

Assistant:

void nn_init (void)
{
    nn_mutex_lock (&self.lock);
    /*  Wait for any in progress term to complete. */
    while (self.flags & NN_CTX_FLAG_TERMING) {
        nn_condvar_wait (&self.cond, &self.lock, -1);
    }
    self.flags &= ~NN_CTX_FLAG_TERMED;
    nn_mutex_unlock (&self.lock);
}